

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-obj-list.c
# Opt level: O0

void object_list_format_section
               (object_list_t *list,textblock *tb,object_list_section_t section,
               wchar_t lines_to_display,wchar_t max_width,char *prefix,_Bool show_others,
               size_t *max_width_result)

{
  ushort uVar1;
  ulong uVar2;
  _Bool _Var3;
  uint8_t attr;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  uint uVar9;
  uint uVar10;
  char *pcVar11;
  size_t local_198;
  size_t local_178;
  wchar_t local_170;
  uint8_t local_169;
  wchar_t c;
  uint8_t a;
  char *direction_x;
  char *direction_y;
  size_t full_width;
  char local_148 [7];
  uint8_t line_attr;
  char location [20];
  size_t max_line_length;
  char *others;
  char *punctuation;
  char line_buffer [200];
  int local_40;
  wchar_t total;
  wchar_t entry_index;
  wchar_t line_count;
  wchar_t remaining_object_total;
  _Bool show_others_local;
  char *prefix_local;
  wchar_t max_width_local;
  wchar_t lines_to_display_local;
  object_list_section_t section_local;
  textblock *tb_local;
  object_list_t *list_local;
  
  total = L'\0';
  pcVar4 = ":";
  if (lines_to_display == L'\0') {
    pcVar4 = ".";
  }
  pcVar5 = "";
  if (show_others) {
    pcVar5 = "other ";
  }
  stack0xfffffffffffffed0 = 0;
  if ((list != (object_list_t *)0x0) && (list->entries != (object_list_entry_t *)0x0)) {
    uVar1 = list->distinct_entries;
    if (list->total_entries[section] == 0) {
      register0x00000000 = strnfmt((char *)&punctuation,200,"%s no objects.\n",prefix);
      if (tb != (textblock *)0x0) {
        textblock_append(tb,"%s",&punctuation);
      }
      if (max_width_result != (size_t *)0x0) {
        if (stack0xfffffffffffffed0 < 0x28) {
          local_178 = 0x28;
        }
        else {
          local_178 = stack0xfffffffffffffed0;
        }
        *max_width_result = local_178;
      }
    }
    else {
      pcVar11 = "s";
      if (list->total_entries[section] == 1) {
        pcVar11 = "";
      }
      register0x00000000 =
           strnfmt((char *)&punctuation,200,"%s %d %sobject%s%s\n",prefix,
                   (ulong)list->total_entries[section],pcVar5,pcVar11,pcVar4);
      if (tb != (textblock *)0x0) {
        textblock_append(tb,"%s",&punctuation);
      }
      for (local_40 = 0; local_40 < (int)(uint)uVar1 && total < lines_to_display;
          local_40 = local_40 + 1) {
        memset(local_148,0,0x14);
        pcVar5 = "S";
        if (list->entries[local_40].dy < 1) {
          pcVar5 = "N";
        }
        pcVar11 = "E";
        if (list->entries[local_40].dx < 1) {
          pcVar11 = "W";
        }
        punctuation._0_1_ = 0;
        if (list->entries[local_40].count[section] != 0) {
          uVar9 = (uint)list->entries[local_40].dy;
          if ((int)uVar9 < 1) {
            uVar9 = -uVar9;
          }
          uVar10 = (uint)list->entries[local_40].dx;
          if ((int)uVar10 < 1) {
            uVar10 = -uVar10;
          }
          strnfmt(local_148,0x14," %d %s %d %s",(ulong)uVar9,pcVar5,(ulong)uVar10,pcVar11,pcVar4);
          sVar6 = utf8_strlen(local_148);
          sVar6 = ((long)(max_width + L'\xfffffffe') - sVar6) - 1;
          object_list_format_name(list->entries + local_40,(char *)&punctuation,200);
          utf8_clipto((char *)&punctuation,sVar6);
          uVar2 = stack0xfffffffffffffed0;
          sVar7 = utf8_strlen((char *)&punctuation);
          if (uVar2 < sVar7 + 0xe) {
            local_198 = utf8_strlen((char *)&punctuation);
            local_198 = local_198 + 0xe;
          }
          else {
            local_198 = stack0xfffffffffffffed0;
          }
          stack0xfffffffffffffed0 = local_198;
          if (((tb != (textblock *)0x0) && (tile_width == '\x01')) && (tile_height == '\x01')) {
            local_169 = '\x04';
            local_170 = L'*';
            _Var3 = is_unknown(list->entries[local_40].object);
            if ((!_Var3) && ((list->entries[local_40].object)->kind != (object_kind *)0x0)) {
              local_169 = object_kind_attr((list->entries[local_40].object)->kind);
              local_170 = object_kind_char((list->entries[local_40].object)->kind);
            }
            textblock_append_pict(tb,local_169,local_170);
            textblock_append(tb," ");
          }
          if (tb != (textblock *)0x0) {
            sVar8 = strlen((char *)&punctuation);
            sVar7 = utf8_strlen((char *)&punctuation);
            attr = object_list_entry_line_attribute(list->entries + local_40);
            textblock_append_c(tb,attr,"%-*s%s\n",(sVar8 - sVar7) + sVar6,&punctuation,local_148);
          }
          total = total + L'\x01';
        }
      }
      if (max_width_result != (size_t *)0x0) {
        *max_width_result = stack0xfffffffffffffed0;
      }
      if (((L'\0' < lines_to_display) &&
          (lines_to_display < (int)(uint)list->total_entries[section])) && (tb != (textblock *)0x0))
      {
        textblock_append(tb,"%6s...and %d others.\n"," ",(ulong)((uint)uVar1 - local_40));
      }
    }
  }
  return;
}

Assistant:

static void object_list_format_section(const object_list_t *list,
									   textblock *tb,
									   object_list_section_t section,
									   int lines_to_display, int max_width,
									   const char *prefix, bool show_others,
									   size_t *max_width_result)
{
	int remaining_object_total = 0;
	int line_count = 0;
	int entry_index;
	int total;
	char line_buffer[200];
	const char *punctuation = (lines_to_display == 0) ? "." : ":";
	const char *others = (show_others) ? "other " : "";
	size_t max_line_length = 0;

	if (list == NULL || list->entries == NULL)
		return;

	total = list->distinct_entries;

	if (list->total_entries[section] == 0) {
		max_line_length = strnfmt(line_buffer, sizeof(line_buffer),
								  "%s no objects.\n", prefix);

		if (tb != NULL)
			textblock_append(tb, "%s", line_buffer);

		/* Force a minimum width so that the prompt doesn't get cut off. */
		if (max_width_result != NULL)
			*max_width_result = MAX(max_line_length, 40);

		return;
	}

	max_line_length = strnfmt(line_buffer, sizeof(line_buffer),
							  "%s %d %sobject%s%s\n", prefix,
							  list->total_entries[section], others,
							  PLURAL(list->total_entries[section]),
							  punctuation);

	if (tb != NULL)
		textblock_append(tb, "%s", line_buffer);

	for (entry_index = 0; entry_index < total && line_count < lines_to_display;
		 entry_index++) {
		char location[20] = { '\0' };
		uint8_t line_attr;
		size_t full_width;
		const char *direction_y = (list->entries[entry_index].dy <= 0) ? "N" : "S";
		const char *direction_x = (list->entries[entry_index].dx <= 0) ? "W" : "E";

		line_buffer[0] = '\0';

		if (list->entries[entry_index].count[section] == 0)
			continue;

		/* Build the location string. */
		strnfmt(location, sizeof(location), " %d %s %d %s",
				abs(list->entries[entry_index].dy), direction_y,
				abs(list->entries[entry_index].dx), direction_x);

		/* Get width available for object name: 2 for char and space; location
		 * includes padding; last -1 for some reason? */
		full_width = max_width - 2 - utf8_strlen(location) - 1;

		/* Add the object count and clip the object name to fit. */
		object_list_format_name(&list->entries[entry_index], line_buffer,
								sizeof(line_buffer));
		utf8_clipto(line_buffer, full_width);

		/* Calculate the width of the line for dynamic sizing; use a fixed max
		 * width for location and object char. */
		max_line_length = MAX(max_line_length,
							  utf8_strlen(line_buffer) + 12 + 2);

		/* textblock_append_pict will safely add the object symbol, regardless
		 * of ASCII/graphics mode. */
		if (tb != NULL && tile_width == 1 && tile_height == 1) {
			uint8_t a = COLOUR_RED;
			wchar_t c = L'*';

			if (!is_unknown(list->entries[entry_index].object) &&
				list->entries[entry_index].object->kind != NULL) {
				a = object_kind_attr(list->entries[entry_index].object->kind);
				c = object_kind_char(list->entries[entry_index].object->kind);
			}

			textblock_append_pict(tb, a, c);
			textblock_append(tb, " ");
		}

		/* Add the left-aligned and padded object name which will align the
		 * location to the right. */
		if (tb != NULL) {
			/*
			 * Hack - Because object name strings are UTF8, we have to add
			 * additional padding for any raw bytes that might be consolidated
			 * into one displayed character.
			 */
			full_width += strlen(line_buffer) - utf8_strlen(line_buffer);
			line_attr = object_list_entry_line_attribute(&list->entries[entry_index]);
			textblock_append_c(tb, line_attr, "%-*s%s\n",
				(int) full_width, line_buffer, location);
		}

		line_count++;
	}

	/* Don't worry about the "...others" line, since it's probably shorter than
	 * what's already printed. */
	if (max_width_result != NULL)
		*max_width_result = max_line_length;

	/* Bail since we don't have enough room to display the remaining count or
	 * since we've displayed them all. */
	if (lines_to_display <= 0 ||
		lines_to_display >= list->total_entries[section])
		return;

	/* Count the remaining objects, starting where we left off in the above
	 * loop. */
	remaining_object_total = total - entry_index;

	if (tb != NULL)
		textblock_append(tb, "%6s...and %d others.\n", " ", remaining_object_total);
}